

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

void __thiscall
duckdb::StandardBufferManager::Unpin
          (StandardBufferManager *this,shared_ptr<duckdb::BlockHandle,_true> *handle)

{
  atomic<int> *paVar1;
  bool bVar2;
  BlockHandle *pBVar3;
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *puVar4;
  type block;
  BlockLock lock;
  unique_lock<std::mutex> local_30;
  
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  local_30._M_device = &pBVar3->lock;
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  puVar4 = BlockHandle::GetBuffer(pBVar3,&local_30);
  if (((puVar4->super_unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)._M_t
       .super___uniq_ptr_impl<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileBuffer_*,_std::default_delete<duckdb::FileBuffer>_>.
       super__Head_base<0UL,_duckdb::FileBuffer_*,_false>._M_head_impl != (FileBuffer *)0x0) &&
     (pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle),
     pBVar3->buffer_type != TINY_BUFFER)) {
    pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    LOCK();
    paVar1 = &pBVar3->readers;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if ((paVar1->super___atomic_base<int>)._M_i == 0) {
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      if ((pBVar3->destroy_buffer_upon)._M_i != UNPIN) {
        bVar2 = BufferPool::AddToEvictionQueue(this->buffer_pool,handle);
        ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
        if (!bVar2) {
          return;
        }
        block = shared_ptr<duckdb::BlockHandle,_true>::operator*(handle);
        BufferPool::PurgeQueue(this->buffer_pool,block);
        return;
      }
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      BlockHandle::Unload(pBVar3,&local_30);
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void StandardBufferManager::Unpin(shared_ptr<BlockHandle> &handle) {
	bool purge = false;
	{
		auto lock = handle->GetLock();
		if (!handle->GetBuffer(lock) || handle->GetBufferType() == FileBufferType::TINY_BUFFER) {
			return;
		}
		D_ASSERT(handle->Readers() > 0);
		auto new_readers = handle->DecrementReaders();
		if (new_readers == 0) {
			VerifyZeroReaders(lock, handle);
			if (handle->MustAddToEvictionQueue()) {
				purge = buffer_pool.AddToEvictionQueue(handle);
			} else {
				handle->Unload(lock);
			}
		}
	}

	// We do not have to keep the handle locked while purging.
	if (purge) {
		PurgeQueue(*handle);
	}
}